

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O3

void duckdb::QuantileOperation::
     ConstantOperation<short,duckdb::QuantileState<short,duckdb::QuantileStandardType>,duckdb::QuantileScalarOperation<false,duckdb::QuantileStandardType>>
               (QuantileState<short,_duckdb::QuantileStandardType> *state,short *input,
               AggregateUnaryInput *unary_input,idx_t count)

{
  iterator __position;
  undefined8 in_RAX;
  undefined8 uStack_28;
  
  if (count != 0) {
    uStack_28 = in_RAX;
    do {
      uStack_28 = CONCAT26(*input,(undefined6)uStack_28);
      __position._M_current =
           (state->v).super_vector<short,_std::allocator<short>_>.
           super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      if (__position._M_current ==
          (state->v).super_vector<short,_std::allocator<short>_>.
          super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        ::std::vector<short,_std::allocator<short>_>::_M_realloc_insert<short>
                  ((vector<short,_std::allocator<short>_> *)state,__position,
                   (short *)((long)&uStack_28 + 6));
      }
      else {
        *__position._M_current = *input;
        (state->v).super_vector<short,_std::allocator<short>_>.
        super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data._M_finish
             = __position._M_current + 1;
      }
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

static void ConstantOperation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input,
	                              idx_t count) {
		for (idx_t i = 0; i < count; i++) {
			Operation<INPUT_TYPE, STATE, OP>(state, input, unary_input);
		}
	}